

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O2

void __thiscall
zstr::istreambuf::istreambuf
          (istreambuf *this,streambuf *_sbuf_p,size_t _buff_size,bool _auto_detect,int _window_bits)

{
  char *pcVar1;
  pointer __p;
  pointer pcVar2;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__istreambuf_00332468;
  this->sbuf_p = _sbuf_p;
  (this->zstrm_p)._M_t.
  super___uniq_ptr_impl<zstr::detail::z_stream_wrapper,_std::default_delete<zstr::detail::z_stream_wrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_zstr::detail::z_stream_wrapper_*,_std::default_delete<zstr::detail::z_stream_wrapper>_>
  .super__Head_base<0UL,_zstr::detail::z_stream_wrapper_*,_false>._M_head_impl =
       (z_stream_wrapper *)0x0;
  (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  this->in_buff_start = (char *)0x0;
  this->in_buff_end = (char *)0x0;
  (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  this->buff_size = _buff_size;
  this->auto_detect = _auto_detect;
  this->auto_detect_run = false;
  this->is_text = false;
  this->window_bits = _window_bits;
  pcVar2 = (pointer)operator_new__(_buff_size);
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
            ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->in_buff,pcVar2);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  pcVar1 = (this->in_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  this->in_buff_start = pcVar1;
  this->in_buff_end = pcVar1;
  pcVar2 = (pointer)operator_new__(this->buff_size);
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)0x0;
  std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
            ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&this->out_buff,pcVar2);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  pcVar1 = (this->out_buff)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl;
  *(char **)&this->field_0x8 = pcVar1;
  *(char **)&this->field_0x10 = pcVar1;
  *(char **)&this->field_0x18 = pcVar1;
  return;
}

Assistant:

istreambuf(std::streambuf* _sbuf_p,
             std::size_t _buff_size = default_buff_size,
             bool _auto_detect = true, int _window_bits = 0)
      : sbuf_p(_sbuf_p),
        in_buff(),
        in_buff_start(nullptr),
        in_buff_end(nullptr),
        out_buff(),
        zstrm_p(nullptr),
        buff_size(_buff_size),
        auto_detect(_auto_detect),
        auto_detect_run(false),
        is_text(false),
        window_bits(_window_bits) {
    assert(sbuf_p);
    in_buff = std::unique_ptr<char[]>(new char[buff_size]);
    in_buff_start = in_buff.get();
    in_buff_end = in_buff.get();
    out_buff = std::unique_ptr<char[]>(new char[buff_size]);
    setg(out_buff.get(), out_buff.get(), out_buff.get());
  }